

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::impl::distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *c,comm *comm)

{
  int iVar1;
  int rank;
  unsigned_long uVar2;
  const_iterator begin;
  const_iterator end;
  iterator out;
  undefined1 local_60 [8];
  block_decomposition<unsigned_long> part;
  size_t total_size;
  size_t local_size;
  comm *local_20;
  comm *comm_local;
  vector<int,_std::allocator<int>_> *c_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_20 = comm;
  comm_local = (comm *)c;
  c_local = __return_storage_ptr__;
  iVar1 = mxx::comm::size(comm);
  if (iVar1 == 1) {
    std::vector<int,_std::allocator<int>_>::vector
              (__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)comm_local);
  }
  else {
    local_size._7_1_ = 0;
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
    total_size = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)comm_local);
    uVar2 = allreduce<unsigned_long>(&total_size,local_20);
    iVar1 = mxx::comm::size(local_20);
    rank = mxx::comm::rank(local_20);
    partition::block_decomposition<unsigned_long>::block_decomposition
              ((block_decomposition<unsigned_long> *)local_60,uVar2,iVar1,rank);
    uVar2 = partition::block_decomposition<unsigned_long>::local_size
                      ((block_decomposition<unsigned_long> *)local_60);
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,uVar2);
    begin = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)comm_local);
    end = std::end<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)comm_local);
    out = std::begin<std::vector<int,std::allocator<int>>>(__return_storage_ptr__);
    distribute<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               begin._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               end._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)out._M_current,
               local_20);
    local_size._7_1_ = 1;
    partition::block_decomposition<unsigned_long>::~block_decomposition
              ((block_decomposition<unsigned_long> *)local_60);
    if ((local_size._7_1_ & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Container distribute(const Container& c, const mxx::comm& comm) {
        if (comm.size() == 1)
            return c;
        Container result;
        size_t local_size = c.size();
        // TODO: this allreduce is duplicated in the `distribute` function
        //       which could be avoided
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        result.resize(part.local_size());

        // call the iterator based implementation
        ::mxx::distribute(std::begin(c), std::end(c), std::begin(result), comm);

        // return the container
        return result;
    }